

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMI_ALG_RSA_DECRYPT_Unmarshal
                 (TPMI_ALG_RSA_DECRYPT *target,BYTE **buffer,INT32 *size,BOOL flag)

{
  TPMI_ALG_RSA_DECRYPT TVar1;
  TPM_RC TVar2;
  
  TVar2 = UINT16_Unmarshal(target,buffer,size);
  if (TVar2 == 0) {
    TVar1 = *target;
    if (((TVar1 == 0x17) || (TVar1 == 0x15)) || ((TVar2 = 0x84, TVar1 == 0x10 && (flag != 0)))) {
      TVar2 = 0;
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPMI_ALG_RSA_DECRYPT_Unmarshal(TPMI_ALG_RSA_DECRYPT *target, BYTE **buffer, INT32 *size, BOOL flag)
{
    TPM_RC    result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch (*target) {
#if         ALG_RSAES
        case TPM_ALG_RSAES:
#endif // ALG_RSAES
#if         ALG_OAEP
        case TPM_ALG_OAEP:
#endif // ALG_OAEP
            break;
        case TPM_ALG_NULL:
        if (flag)
            break;
        return TPM_RC_VALUE;
        default:
            return TPM_RC_VALUE;
    }
    return TPM_RC_SUCCESS;
}